

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rungame.c
# Opt level: O3

void rungame(nh_bool tutorial)

{
  nh_bool nVar1;
  char cVar2;
  int __fd;
  int iVar3;
  size_t sVar4;
  time_t tVar5;
  int align;
  int gend;
  int race;
  int role;
  char plname [256];
  fnchar savedir [256];
  char nameprompt [128];
  char chardesc [128];
  fnchar filename [1024];
  wchar_t local_748;
  wchar_t local_744;
  wchar_t local_740;
  wchar_t local_73c;
  char local_738 [31];
  undefined1 local_719;
  char local_638 [256];
  char local_538 [128];
  undefined1 local_4b8 [128];
  char local_438 [1032];
  
  local_73c = initrole;
  local_740 = initrace;
  local_744 = initgend;
  local_748 = initalign;
  nVar1 = get_gamedir(SAVE_DIR,local_638);
  if (nVar1 != '\0') {
    nVar1 = player_selection(&local_73c,&local_740,&local_744,&local_748,(int)random_player,tutorial
                            );
    if (nVar1 != '\0') {
      strncpy(local_738,settings.plname,0x20);
      local_719 = 0;
      if (ui_flags.playmode == 3) {
        builtin_strncpy(local_738,"wizard",7);
      }
      nh_root_plselection_prompt(local_4b8,0x7f,local_73c,local_740,local_744,local_748);
      snprintf(local_538,0x80,"You are a %s.  What is your name?",local_4b8);
      while (local_738[0] == '\0') {
        curses_getline(local_538,local_738);
        sVar4 = strlen(local_738);
        if (0x1f < sVar4) {
          curses_msgwin("That name is too long.");
          local_738[0] = '\0';
        }
      }
      if (local_738[0] != '\x1b') {
        tVar5 = time((time_t *)0x0);
        snprintf(local_438,0x400,"%s%ld_%s.nhgame",local_638,tVar5,local_738);
        __fd = open(local_438,0x242,0x1b0);
        if (__fd == -1) {
          curses_raw_print("Could not create the logfile.");
        }
        else {
          create_game_windows();
          reset_old_status();
          iVar3 = 1;
          if (tutorial == '\0') {
            iVar3 = ui_flags.playmode;
          }
          cVar2 = nh_start_game(__fd,local_738,local_73c,local_740,local_744,local_748,iVar3);
          if (cVar2 == '\0') {
            destroy_game_windows();
            close(__fd);
          }
          else {
            load_keymap();
            iVar3 = commandloop();
            free_keymap();
            close(__fd);
            destroy_game_windows();
            cleanup_messages();
            game_ended(iVar3,local_438);
          }
        }
      }
    }
    return;
  }
  curses_raw_print("Could not find where to put the logfile for a new game.");
  return;
}

Assistant:

void rungame(nh_bool tutorial)
{
    int ret, role = initrole, race = initrace, gend = initgend, align = initalign;
    int fd = -1;
    char chardesc[QBUFSZ];
    char nameprompt[QBUFSZ];
    char plname[BUFSZ];
    fnchar filename[1024];
    fnchar savedir[BUFSZ];
    long t;
    
    if (!get_gamedir(SAVE_DIR, savedir)) {
	curses_raw_print("Could not find where to put the logfile for a new game.");
	return;
    }
    
    if (!player_selection(&role, &race, &gend, &align, random_player, tutorial))
	return;
    
    strncpy(plname, settings.plname, PL_NSIZ);
    plname[PL_NSIZ - 1] = 0;
    /* The player name is set to "wizard" (again) in nh_start_game, so setting
     * it here just prevents wizmode player from being asked for a name. */
    if (ui_flags.playmode == MODE_WIZARD)
	strcpy(plname, "wizard");

    nh_root_plselection_prompt(chardesc, QBUFSZ - 1, role, race, gend, align);
    snprintf(nameprompt, QBUFSZ, "You are a %s.  What is your name?", chardesc);
    while (!plname[0]) {
	curses_getline(nameprompt, plname);
	if (strlen(plname) >= PL_NSIZ) {
	    curses_msgwin("That name is too long.");
	    plname[0] = 0;
	}
    }
    if (plname[0] == '\033') /* canceled */
	return;

    t = (long)time(NULL);
#if defined(WIN32)
    _snwprintf(filename, 1024, L"%ls%ld_%hs.nhgame", savedir, t, plname);
    filename[1023] = 0;
#else
    snprintf(filename, 1024, "%s%ld_%s.nhgame", savedir, t, plname);
#endif
    fd = sys_open(filename, O_TRUNC | O_CREAT | O_RDWR, FILE_OPEN_MASK);
    if (fd == -1) {
	curses_raw_print("Could not create the logfile.");
	return;
    }
    
    create_game_windows();
    reset_old_status();
    if (!nh_start_game(fd, plname, role, race, gend, align,
		       tutorial ? MODE_TUTORIAL : ui_flags.playmode)) {
	destroy_game_windows();
	close(fd);
	return;
    }
    
    load_keymap(); /* need to load the keymap after the game has been started */
    ret = commandloop();
    free_keymap();
    close(fd);
    
    destroy_game_windows();
    cleanup_messages();
    game_ended(ret, filename);
}